

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void speech_prog_oze(CHAR_DATA *mob,CHAR_DATA *ch,char *speech)

{
  PC_DATA *pPVar1;
  bool bVar2;
  int iVar3;
  AFFECT_DATA *pAVar4;
  CHAR_DATA *in_RSI;
  long in_RDI;
  char buf [4608];
  AFFECT_DATA *af;
  char *in_stack_00002198;
  CHAR_DATA *in_stack_000021a0;
  void *in_stack_ffffffffffffea98;
  undefined1 fBoth;
  CHAR_DATA *in_stack_ffffffffffffeaa0;
  CHAR_DATA *in_stack_ffffffffffffeaa8;
  char *pcVar5;
  CHAR_DATA *in_stack_ffffffffffffeab0;
  char *in_stack_ffffffffffffeac0;
  char *in_stack_ffffffffffffeac8;
  allocator<char> *in_stack_ffffffffffffead0;
  allocator<char> *__a;
  char *in_stack_ffffffffffffead8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  allocator<char> local_14a9;
  string local_14a8 [39];
  allocator<char> local_1481;
  string local_1480 [36];
  undefined4 local_145c;
  undefined8 local_1458;
  undefined8 local_1450;
  char_data **in_stack_ffffffffffffebb8;
  _func_void_char_data_ptr *in_stack_ffffffffffffebc0;
  string *in_stack_ffffffffffffebc8;
  string *in_stack_ffffffffffffebd0;
  int in_stack_ffffffffffffebdc;
  CQueue *in_stack_ffffffffffffebe0;
  string local_1418 [39];
  allocator<char> local_13f1;
  string local_13f0 [39];
  allocator<char> local_13c9;
  string local_13c8 [39];
  allocator<char> local_13a1;
  string local_13a0 [8];
  char (*in_stack_ffffffffffffec68) [86];
  _func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_char_data_ptr_obj_data_ptr_char_data_ptr_int
  *in_stack_ffffffffffffec70;
  string *in_stack_ffffffffffffec78;
  string *in_stack_ffffffffffffec80;
  string local_1378 [4];
  int in_stack_ffffffffffffec8c;
  CQueue *in_stack_ffffffffffffec90;
  char_data **in_stack_ffffffffffffec98;
  char_data **in_stack_ffffffffffffeca0;
  uint in_stack_ffffffffffffeca8;
  undefined4 in_stack_ffffffffffffecac;
  string *in_stack_ffffffffffffecb0;
  int *in_stack_ffffffffffffecb8;
  CQueue *in_stack_ffffffffffffecc0;
  string local_1338 [8];
  char (*in_stack_ffffffffffffecd0) [174];
  allocator<char> local_1311;
  string local_1310 [39];
  allocator<char> local_12e9;
  string local_12e8 [39];
  allocator<char> local_12c1;
  string local_12c0 [36];
  undefined4 local_129c;
  undefined8 local_1298;
  undefined8 local_1290;
  allocator<char> local_1281;
  string local_1280 [55];
  allocator<char> local_1249;
  string local_1248 [32];
  char local_1228 [3872];
  char *in_stack_fffffffffffffcf8;
  CHAR_DATA *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffe20;
  CHAR_DATA *in_stack_fffffffffffffe28;
  
  pAVar4 = affect_find(*(AFFECT_DATA **)(in_RDI + 0x88),(int)gsn_greater_demon);
  if (((pAVar4 != (AFFECT_DATA *)0x0) && (pAVar4->owner != (CHAR_DATA *)0x0)) &&
     (in_RSI == pAVar4->owner)) {
    bVar2 = str_prefix(in_stack_ffffffffffffeac8,in_stack_ffffffffffffeac0);
    if (bVar2) {
      bVar2 = str_prefix(in_stack_ffffffffffffeac8,in_stack_ffffffffffffeac0);
      if (bVar2) {
        do_say(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      }
      else {
        pcVar5 = local_1228;
        sprintf(pcVar5,"The abyss will not forget this treachery, %s.",in_RSI->name);
        do_whisper(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &stack0xffffffffffffebe7;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,in_stack_ffffffffffffead0);
        __a = (allocator<char> *)&stack0xffffffffffffebbf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,__a);
        local_1450 = 0;
        local_1458 = 0;
        local_145c = 0;
        CQueue::
        AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[86],char_data*&,decltype(nullptr),decltype(nullptr),int>
                  (in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c,in_stack_ffffffffffffec80,
                   in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,in_stack_ffffffffffffec68,
                   in_stack_ffffffffffffeca0,
                   (void **)CONCAT44(in_stack_ffffffffffffecac,in_stack_ffffffffffffeca8),
                   (void **)in_stack_ffffffffffffecb0,in_stack_ffffffffffffecb8);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffebc0);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffebbf);
        std::__cxx11::string::~string(local_1418);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffebe7);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,__a);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this,pcVar5,__a);
        CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                  (in_stack_ffffffffffffebe0,in_stack_ffffffffffffebdc,in_stack_ffffffffffffebd0,
                   in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
        std::__cxx11::string::~string(local_14a8);
        std::allocator<char>::~allocator(&local_14a9);
        std::__cxx11::string::~string(local_1480);
        std::allocator<char>::~allocator(&local_1481);
        in_RSI->pcdata->greaterdata[0] = -1;
      }
    }
    else {
      WAIT_STATE(in_stack_ffffffffffffeab0,(int)((ulong)in_stack_ffffffffffffeaa8 >> 0x20));
      act((char *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
          in_stack_ffffffffffffea98,0);
      fBoth = (undefined1)((ulong)in_stack_ffffffffffffea98 >> 0x38);
      sprintf(local_1228,"\'siphon\' %s",in_RSI->name);
      do_cast(in_stack_000021a0,in_stack_00002198);
      stop_fighting(in_stack_ffffffffffffeaa0,(bool)fBoth);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      local_1290 = 0;
      local_1298 = 0;
      local_129c = 0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[79],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c,in_stack_ffffffffffffec80,
                 in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,
                 (char (*) [79])in_stack_ffffffffffffec68,in_stack_ffffffffffffeca0,
                 (void **)CONCAT44(in_stack_ffffffffffffecac,in_stack_ffffffffffffeca8),
                 (void **)in_stack_ffffffffffffecb0,in_stack_ffffffffffffecb8);
      iVar3 = (int)((ulong)in_stack_ffffffffffffecb8 >> 0x20);
      std::__cxx11::string::~string(local_1280);
      std::allocator<char>::~allocator(&local_1281);
      std::__cxx11::string::~string(local_1248);
      std::allocator<char>::~allocator(&local_1249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,char_const(&)[174]>
                (in_stack_ffffffffffffecc0,iVar3,in_stack_ffffffffffffecb0,
                 (string *)CONCAT44(in_stack_ffffffffffffecac,in_stack_ffffffffffffeca8),
                 (_func_void_char_data_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                  *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffec98,in_stack_ffffffffffffecd0);
      std::__cxx11::string::~string(local_12e8);
      std::allocator<char>::~allocator(&local_12e9);
      std::__cxx11::string::~string(local_12c0);
      std::allocator<char>::~allocator(&local_12c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      pcVar5 = &stack0xffffffffffffecb0;
      CQueue::
      AddToQueue<void(*)(std::__cxx11::string,char_data*,obj_data*,char_data*,int),char_const(&)[81],char_data*&,decltype(nullptr),decltype(nullptr),int>
                (in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c,in_stack_ffffffffffffec80,
                 in_stack_ffffffffffffec78,in_stack_ffffffffffffec70,
                 (char (*) [81])in_stack_ffffffffffffec68,in_stack_ffffffffffffeca0,
                 (void **)(ulong)in_stack_ffffffffffffeca8,(void **)0x0,(int *)0x0);
      std::__cxx11::string::~string(local_1338);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffecc7);
      std::__cxx11::string::~string(local_1310);
      std::allocator<char>::~allocator(&local_1311);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (in_stack_ffffffffffffebe0,in_stack_ffffffffffffebdc,in_stack_ffffffffffffebd0,
                 in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
      std::__cxx11::string::~string(local_13a0);
      std::allocator<char>::~allocator(&local_13a1);
      std::__cxx11::string::~string(local_1378);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffec87);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8,in_stack_ffffffffffffead0);
      CQueue::AddToQueue<void(*)(char_data*),char_data*&>
                (in_stack_ffffffffffffebe0,in_stack_ffffffffffffebdc,in_stack_ffffffffffffebd0,
                 in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
      std::__cxx11::string::~string(local_13f0);
      std::allocator<char>::~allocator(&local_13f1);
      std::__cxx11::string::~string(local_13c8);
      std::allocator<char>::~allocator(&local_13c9);
      in_RSI->pcdata->greaterdata[0] = 2;
      pPVar1 = in_RSI->pcdata;
      iVar3 = skill_lookup(pcVar5);
      pPVar1->learned[iVar3] = 1;
      in_RSI->pcdata->perm_hit = in_RSI->pcdata->perm_hit + -0x46;
      in_RSI->max_hit = in_RSI->max_hit + -0x46;
      in_RSI->hit = (int)in_RSI->max_hit;
    }
  }
  return;
}

Assistant:

void speech_prog_oze(CHAR_DATA *mob, CHAR_DATA *ch, char *speech)
{
	AFFECT_DATA *af = affect_find(mob->affected, gsn_greater_demon);
	char buf[MSL];

	if (!af || !af->owner)
		return;

	if (ch != af->owner)
		return;

	if (!str_prefix("yes", speech))
	{
		WAIT_STATE(ch, 3 * PULSE_VIOLENCE);

		act("Eyes flickering with nearly extinguished flame, Oze incants a phrase.", mob, 0, 0, TO_ROOM);

		sprintf(buf, "'siphon' %s", ch->name);
		do_cast(mob, buf);

		stop_fighting(mob, true);

		RS.Queue.AddToQueue(3, "speech_prog_oze", "act_queue", act_queue, "Suddenly rejuvenated, Oze begins to growl deep in his torso of exposed organs.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(5, "speech_prog_oze", "do_say_queue", do_say_queue, mob, "I would say that your deed would be remembered... but as you were the one who put me here in the first place,  I doubt very much that you would wish it so.  I take my leave.");
		RS.Queue.AddToQueue(7, "speech_prog_oze", "act_queue", act_queue, "With a squelching sound, Oze thins into a gout of blood and shoots into the sky.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(8, "speech_prog_oze", "delay_extract", delay_extract, mob);
		RS.Queue.AddToQueue(8, "speech_prog_oze", "save_char_obj", save_char_obj, ch);
		ch->pcdata->greaterdata[GREATER_OZE] = FAVOR_GRANTED;
		ch->pcdata->learned[skill_lookup("leech")] = 1;
		ch->pcdata->perm_hit -= 70;
		ch->max_hit -= 70;
		ch->hit = ch->max_hit;
		return;
	}

	if (!str_prefix("no", speech))
	{
		sprintf(buf, "The abyss will not forget this treachery, %s.", ch->name);
		do_whisper(mob, buf);

		RS.Queue.AddToQueue(1, "speech_prog_oze", "act_queue", act_queue, "The puddle of gore before you that was once a greater demon dissolves into the earth.", mob, nullptr, nullptr, TO_ROOM);
		RS.Queue.AddToQueue(2, "speech_prog_oze", "delay_extract", delay_extract, mob);
		ch->pcdata->greaterdata[GREATER_OZE] = FAVOR_FAILED;
		return;
	}

	do_say(mob, "The choice is a simple one, mortal.  Yes or no?");
}